

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::SegmentBTree::InsertNonFullNode
               (Recycler *recycler,SegmentBTree *node,SparseArraySegmentBase *newSeg)

{
  uint uVar1;
  Type TVar2;
  uint uVar3;
  SparseArraySegmentBase *pSVar4;
  code *pcVar5;
  SegmentBTree *pSVar6;
  bool bVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  uint **ppuVar10;
  SparseArraySegmentBase ***pppSVar11;
  Recycler *pRVar12;
  SparseArraySegmentBase **ptr;
  uint *ptr_00;
  SegmentBTree **ppSVar13;
  uint local_9c;
  uint32 i_1;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  uint local_24;
  SparseArraySegmentBase *pSStack_20;
  uint32 i;
  SparseArraySegmentBase *newSeg_local;
  SegmentBTree *node_local;
  Recycler *recycler_local;
  
  pSStack_20 = newSeg;
  newSeg_local = (SparseArraySegmentBase *)node;
  node_local = (SegmentBTree *)recycler;
  BVar8 = IsFullNode(node);
  if (BVar8 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x135,"(!node->IsFullNode())","!node->IsFullNode()");
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (0x26 < newSeg_local[1].left) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x136,"(node->segmentCount < MaxKeys)",
                                "node->segmentCount < MaxKeys");
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (pSStack_20 == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x137,"(newSeg != __null)","newSeg != NULL");
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  BVar8 = IsLeaf((SegmentBTree *)newSeg_local);
  if (BVar8 == 0) {
    local_9c = newSeg_local[1].left;
    do {
      uVar1 = local_9c;
      local_9c = uVar1 - 1;
      bVar7 = false;
      if (local_9c != 0xffffffff) {
        uVar3 = pSStack_20->left;
        ppuVar10 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                             ((WriteBarrierPtr *)newSeg_local);
        bVar7 = uVar3 < (*ppuVar10)[local_9c];
      }
    } while (bVar7);
    ppSVar13 = Memory::WriteBarrierPtr::operator_cast_to_SegmentBTree__
                         ((WriteBarrierPtr *)&newSeg_local->next);
    BVar8 = IsFullNode(*ppSVar13 + uVar1);
    pSVar6 = node_local;
    pSVar4 = newSeg_local;
    local_9c = uVar1;
    if (BVar8 != 0) {
      ppSVar13 = Memory::WriteBarrierPtr::operator_cast_to_SegmentBTree__
                           ((WriteBarrierPtr *)&newSeg_local->next);
      SplitChild((Recycler *)pSVar6,(SegmentBTree *)pSVar4,uVar1,*ppSVar13 + uVar1);
      ppuVar10 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                           ((WriteBarrierPtr *)newSeg_local);
      uVar3 = (*ppuVar10)[uVar1];
      pppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                            ((WriteBarrierPtr *)&newSeg_local->size);
      if (uVar3 != (*pppSVar11)[uVar1]->left) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x15e,"(node->keys[i] == node->segments[i]->left)",
                                    "node->keys[i] == node->segments[i]->left");
        if (!bVar7) {
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      uVar3 = pSStack_20->left;
      ppuVar10 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                           ((WriteBarrierPtr *)newSeg_local);
      if ((*ppuVar10)[uVar1] < uVar3) {
        local_9c = uVar1 + 1;
      }
    }
    pSVar6 = node_local;
    ppSVar13 = Memory::WriteBarrierPtr::operator_cast_to_SegmentBTree__
                         ((WriteBarrierPtr *)&newSeg_local->next);
    InsertNonFullNode((Recycler *)pSVar6,*ppSVar13 + local_9c,pSStack_20);
  }
  else {
    local_24 = newSeg_local[1].left;
    while( true ) {
      local_24 = local_24 - 1;
      bVar7 = false;
      if (local_24 != 0xffffffff) {
        uVar1 = pSStack_20->left;
        ppuVar10 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                             ((WriteBarrierPtr *)newSeg_local);
        bVar7 = uVar1 < (*ppuVar10)[local_24];
      }
      if (!bVar7) break;
      pppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                            ((WriteBarrierPtr *)&newSeg_local->size);
      pSVar4 = (*pppSVar11)[local_24];
      pppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                            ((WriteBarrierPtr *)&newSeg_local->size);
      (*pppSVar11)[local_24 + 1] = pSVar4;
      ppuVar10 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                           ((WriteBarrierPtr *)newSeg_local);
      uVar1 = (*ppuVar10)[local_24];
      ppuVar10 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                           ((WriteBarrierPtr *)newSeg_local);
      (*ppuVar10)[local_24 + 1] = uVar1;
    }
    pppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                          ((WriteBarrierPtr *)&newSeg_local->size);
    pSVar6 = node_local;
    if (*pppSVar11 == (SparseArraySegmentBase **)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_50,(type_info *)&SparseArraySegmentBase*::typeinfo,0,0x27,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                 ,0x147);
      pRVar12 = Memory::Recycler::TrackAllocInfo((Recycler *)pSVar6,&local_50);
      local_60 = Memory::Recycler::AllocLeafZero;
      local_58 = 0;
      ptr = Memory::AllocateArray<Memory::Recycler,Js::SparseArraySegmentBase*,false>
                      ((Memory *)pRVar12,(Recycler *)Memory::Recycler::AllocLeafZero,0,0x27);
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase_*>::operator=
                ((WriteBarrierPtr<Js::SparseArraySegmentBase_*> *)&newSeg_local->size,ptr);
      pSVar6 = node_local;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_88,(type_info *)&unsigned_int::typeinfo,0,0x27,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                 ,0x148);
      pRVar12 = Memory::Recycler::TrackAllocInfo((Recycler *)pSVar6,&local_88);
      ptr_00 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                         ((Memory *)pRVar12,(Recycler *)Memory::Recycler::AllocLeafZero,0,0x27);
      Memory::WriteBarrierPtr<unsigned_int>::operator=
                ((WriteBarrierPtr<unsigned_int> *)newSeg_local,ptr_00);
    }
    pSVar4 = pSStack_20;
    pppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                          ((WriteBarrierPtr *)&newSeg_local->size);
    (*pppSVar11)[local_24 + 1] = pSVar4;
    TVar2 = pSStack_20->left;
    ppuVar10 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                         ((WriteBarrierPtr *)newSeg_local);
    (*ppuVar10)[local_24 + 1] = TVar2;
    newSeg_local[1].left = newSeg_local[1].left + 1;
  }
  return;
}

Assistant:

void SegmentBTree::InsertNonFullNode(Recycler* recycler, SegmentBTree* node, SparseArraySegmentBase* newSeg)
    {
        Assert(!node->IsFullNode());
        AnalysisAssert(node->segmentCount < MaxKeys);       // Same as !node->IsFullNode()
        Assert(newSeg != NULL);

        if (node->IsLeaf())
        {
            // Move the keys
            uint32 i = node->segmentCount - 1;
            while( (i != -1) && (newSeg->left < node->keys[i]))
            {
                node->segments[i+1] = node->segments[i];
                node->keys[i+1] = node->keys[i];
                i--;
            }
            if (!node->segments)
            {
                // Even though the segments point to a GC pointer, the main array should keep a references
                // as well.  So just make it a leaf allocation
                node->segments = AllocatorNewArrayLeafZ(Recycler, recycler, SparseArraySegmentBase*, MaxKeys);
                node->keys = AllocatorNewArrayLeafZ(Recycler, recycler, uint32, MaxKeys);
            }
            node->segments[i + 1] = newSeg;
            node->keys[i + 1] = newSeg->left;
            node->segmentCount++;
        }
        else
        {
            // find the correct child node
            uint32 i = node->segmentCount-1;

            while((i != -1) && (newSeg->left < node->keys[i]))
            {
                i--;
            }
            i++;

            // Make room if full
            if(node->children[i].IsFullNode())
            {
                // This split doesn't make the tree any deeper as node already has children.
                SplitChild(recycler, node, i, node->children+i);
                Assert(node->keys[i] == node->segments[i]->left);
                if (newSeg->left > node->keys[i])
                {
                    i++;
                }
            }
            InsertNonFullNode(recycler, node->children+i, newSeg);
        }
    }